

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_help
          (string *__return_storage_ptr__,Formatter *this,App *app,string *name,AppFormatMode mode)

{
  string *psVar1;
  string local_2a8 [32];
  string local_288 [32];
  string local_268;
  string local_248 [32];
  string local_228 [32];
  string local_208 [48];
  string local_1d8 [32];
  stringstream local_1b8 [8];
  stringstream out;
  ostream local_1a8 [380];
  AppFormatMode local_2c;
  string *psStack_28;
  AppFormatMode mode_local;
  string *name_local;
  App *app_local;
  Formatter *this_local;
  
  local_2c = mode;
  psStack_28 = name;
  name_local = (string *)app;
  app_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  if (mode == Sub) {
    (*(this->super_FormatterBase)._vptr_FormatterBase[7])(__return_storage_ptr__,this,app);
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    (*(this->super_FormatterBase)._vptr_FormatterBase[9])(local_1d8,this,name_local);
    ::std::operator<<(local_1a8,local_1d8);
    ::std::__cxx11::string::~string(local_1d8);
    psVar1 = name_local;
    ::std::__cxx11::string::string(local_228,(string *)name);
    (*(this->super_FormatterBase)._vptr_FormatterBase[10])(local_208,this,psVar1,local_228);
    ::std::operator<<(local_1a8,local_208);
    ::std::__cxx11::string::~string(local_208);
    ::std::__cxx11::string::~string(local_228);
    (*(this->super_FormatterBase)._vptr_FormatterBase[4])(local_248,this,name_local);
    ::std::operator<<(local_1a8,local_248);
    ::std::__cxx11::string::~string(local_248);
    make_groups_abi_cxx11_(&local_268,this,(App *)name_local,local_2c);
    ::std::operator<<(local_1a8,(string *)&local_268);
    ::std::__cxx11::string::~string((string *)&local_268);
    (*(this->super_FormatterBase)._vptr_FormatterBase[5])(local_288,this,name_local,(ulong)local_2c)
    ;
    ::std::operator<<(local_1a8,local_288);
    ::std::__cxx11::string::~string(local_288);
    (*(this->super_FormatterBase)._vptr_FormatterBase[8])(local_2a8,this,name_local);
    ::std::operator<<(local_1a8,local_2a8);
    ::std::__cxx11::string::~string(local_2a8);
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_help(const App *app, std::string name, AppFormatMode mode) const {

    // This immediatly forwards to the make_expanded method. This is done this way so that subcommands can
    // have overridden formatters
    if(mode == AppFormatMode::Sub)
        return make_expanded(app);

    std::stringstream out;

    out << make_description(app);
    out << make_usage(app, name);
    out << make_positionals(app);
    out << make_groups(app, mode);
    out << make_subcommands(app, mode);
    out << make_footer(app);

    return out.str();
}